

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_list_test.c
# Opt level: O0

int main(int argc,char **argv)

{
  REF_STATUS RVar1;
  uint uVar2;
  REF_STATUS ref_private_macro_code_rss_37;
  REF_STATUS ref_private_macro_code_rss_36;
  REF_STATUS ref_private_macro_code_rss_35;
  REF_LONG ref_private_status_reis_bi_12;
  REF_LONG ref_private_status_reis_ai_12;
  REF_STATUS ref_private_macro_code_rss_34;
  REF_LONG ref_private_status_reis_bi_11;
  REF_LONG ref_private_status_reis_ai_11;
  REF_STATUS ref_private_macro_code_rss_33;
  REF_LONG ref_private_status_reis_bi_10;
  REF_LONG ref_private_status_reis_ai_10;
  REF_STATUS ref_private_macro_code_rss_32;
  REF_LONG ref_private_status_reis_bi_9;
  REF_LONG ref_private_status_reis_ai_9;
  REF_STATUS ref_private_macro_code_rss_31;
  REF_STATUS ref_private_macro_code_rss_30;
  REF_STATUS ref_private_macro_code_rss_29;
  REF_LONG ref_private_status_reis_bi_8;
  REF_LONG ref_private_status_reis_ai_8;
  REF_STATUS ref_private_macro_code_rss_28;
  REF_INT item_4;
  REF_STATUS ref_private_macro_code_rss_27;
  REF_LONG ref_private_status_reis_bi_7;
  REF_LONG ref_private_status_reis_ai_7;
  REF_STATUS ref_private_macro_code_rss_26;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_BOOL contains;
  REF_INT item_3;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_INT max;
  REF_INT item_2;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_INT last;
  REF_INT item_1;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  uint local_80;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_INT item;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_LIST original;
  long lStack_58;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  long lStack_40;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_MPI ref_mpi;
  REF_LIST ref_list;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ref_list = (REF_LIST)argv;
  argv_local._0_4_ = argc;
  ref_private_status_reis_ai._4_4_ = ref_mpi_start(argc,argv);
  if (ref_private_status_reis_ai._4_4_ == 0) {
    ref_private_status_reis_ai._0_4_ = ref_mpi_create((REF_MPI *)&ref_private_macro_code_rss_1);
    if ((uint)ref_private_status_reis_ai == 0) {
      ref_private_status_reis_bi = 2;
      RVar1 = ref_list_free((REF_LIST)0x0);
      lStack_40 = (long)RVar1;
      if (ref_private_status_reis_bi == lStack_40) {
        ref_private_status_reis_ai_1._4_4_ = ref_list_create((REF_LIST *)&ref_mpi);
        if (ref_private_status_reis_ai_1._4_4_ == 0) {
          ref_private_status_reis_bi_1 = 0;
          lStack_58 = (long)ref_mpi->n;
          if (lStack_58 == 0) {
            original._4_4_ = ref_list_free((REF_LIST)ref_mpi);
            if (original._4_4_ == 0) {
              ref_private_macro_code_rss_6 =
                   ref_list_create((REF_LIST *)&ref_private_macro_code_rss_5);
              if (ref_private_macro_code_rss_6 == 0) {
                ref_private_macro_code_rss_7 =
                     ref_list_deep_copy((REF_LIST *)&ref_mpi,_ref_private_macro_code_rss_5);
                if (ref_private_macro_code_rss_7 == 0) {
                  item = ref_list_free(_ref_private_macro_code_rss_5);
                  if (item == 0) {
                    ref_private_macro_code_rss_8 = ref_list_free((REF_LIST)ref_mpi);
                    if (ref_private_macro_code_rss_8 == 0) {
                      local_80 = ref_list_create((REF_LIST *)&ref_mpi);
                      if (local_80 == 0) {
                        ref_private_macro_code_rss_9 = 0x1b;
                        ref_private_status_reis_ai_2._4_4_ = ref_list_push((REF_LIST)ref_mpi,0x1b);
                        if (ref_private_status_reis_ai_2._4_4_ == 0) {
                          ref_private_status_reis_bi_2 = 1;
                          _item_1 = (long)ref_mpi->n;
                          if (_item_1 == 1) {
                            last = ref_list_free((REF_LIST)ref_mpi);
                            if (last == 0) {
                              ref_private_status_reis_ai_3._0_4_ =
                                   ref_list_create((REF_LIST *)&ref_mpi);
                              if ((uint)ref_private_status_reis_ai_3 == 0) {
                                ref_private_status_reis_bi_3 = 1;
                                RVar1 = ref_list_pop((REF_LIST)ref_mpi,
                                                     (REF_INT *)
                                                     ((long)&ref_private_status_reis_ai_3 + 4));
                                _ref_private_macro_code_rss_13 = (long)RVar1;
                                if (ref_private_status_reis_bi_3 == _ref_private_macro_code_rss_13)
                                {
                                  ref_private_macro_code_rss_11 = 0x1b;
                                  ref_private_status_reis_ai_4._4_4_ =
                                       ref_list_push((REF_LIST)ref_mpi,0x1b);
                                  if (ref_private_status_reis_ai_4._4_4_ == 0) {
                                    ref_private_status_reis_ai_4._0_4_ =
                                         ref_list_pop((REF_LIST)ref_mpi,
                                                      (REF_INT *)
                                                      ((long)&ref_private_status_reis_ai_3 + 4));
                                    if ((uint)ref_private_status_reis_ai_4 == 0) {
                                      ref_private_status_reis_bi_4 = 0;
                                      _item_2 = (long)ref_mpi->n;
                                      if (_item_2 == 0) {
                                        max = ref_list_free((REF_LIST)ref_mpi);
                                        if (max == 0) {
                                          ref_private_macro_code_rss_17 =
                                               ref_list_create((REF_LIST *)&ref_mpi);
                                          if (ref_private_macro_code_rss_17 == 0) {
                                            ref_private_macro_code_rss_16 = ref_mpi->id;
                                            ref_private_macro_code_rss_17 = 0;
                                            for (ref_private_macro_code_rss_15 = 0;
                                                ref_private_macro_code_rss_15 <=
                                                ref_private_macro_code_rss_16;
                                                ref_private_macro_code_rss_15 =
                                                     ref_private_macro_code_rss_15 + 1) {
                                              ref_private_macro_code_rss_18 =
                                                   ref_list_push((REF_LIST)ref_mpi,
                                                                 ref_private_macro_code_rss_15);
                                              if (ref_private_macro_code_rss_18 != 0) {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x4e,"main",
                                                  (ulong)(uint)ref_private_macro_code_rss_18,"store"
                                                  );
                                                return ref_private_macro_code_rss_18;
                                              }
                                              ref_private_macro_code_rss_18 = 0;
                                            }
                                            if (ref_private_macro_code_rss_16 < ref_mpi->id) {
                                              ref_private_macro_code_rss_19 =
                                                   ref_list_free((REF_LIST)ref_mpi);
                                              if (ref_private_macro_code_rss_19 == 0) {
                                                ref_private_macro_code_rss_20 =
                                                     ref_list_create((REF_LIST *)&ref_mpi);
                                                if (ref_private_macro_code_rss_20 == 0) {
                                                  ref_private_macro_code_rss_21 =
                                                       ref_list_push((REF_LIST)ref_mpi,0x14);
                                                  if (ref_private_macro_code_rss_21 == 0) {
                                                    ref_private_status_reis_ai_5._4_4_ =
                                                         ref_list_push((REF_LIST)ref_mpi,10);
                                                    if (ref_private_status_reis_ai_5._4_4_ == 0) {
                                                      ref_private_status_reis_ai_5._0_4_ =
                                                           ref_list_erase((REF_LIST)ref_mpi);
                                                      if ((uint)ref_private_status_reis_ai_5 == 0) {
                                                        ref_private_status_reis_bi_5 = 0;
                                                        _item_3 = (long)ref_mpi->n;
                                                        if (_item_3 == 0) {
                                                          contains = ref_list_free((REF_LIST)ref_mpi
                                                                                  );
                                                          if (contains == 0) {
                                                            uVar2 = ref_list_create((REF_LIST *)
                                                                                    &ref_mpi);
                                                            if (uVar2 == 0) {
                                                              ref_private_macro_code_rss_23 = 0x1b;
                                                              uVar2 = ref_list_push((REF_LIST)
                                                                                    ref_mpi,0x1b);
                                                              if (uVar2 == 0) {
                                                                uVar2 = ref_list_contains((REF_LIST)
                                                                                          ref_mpi,
                                                  ref_private_macro_code_rss_23,
                                                  &ref_private_macro_code_rss_24);
                                                  if (uVar2 == 0) {
                                                    if ((long)ref_private_macro_code_rss_24 == 1) {
                                                      uVar2 = ref_list_contains((REF_LIST)ref_mpi,5,
                                                                                &
                                                  ref_private_macro_code_rss_24);
                                                  if (uVar2 == 0) {
                                                    if ((long)ref_private_macro_code_rss_24 == 0) {
                                                      uVar2 = ref_list_free((REF_LIST)ref_mpi);
                                                      if (uVar2 == 0) {
                                                        uVar2 = ref_list_create((REF_LIST *)&ref_mpi
                                                                               );
                                                        if (uVar2 == 0) {
                                                          RVar1 = ref_list_delete((REF_LIST)ref_mpi,
                                                                                  5);
                                                          if ((long)RVar1 == 5) {
                                                            uVar2 = ref_list_push((REF_LIST)ref_mpi,
                                                                                  0x15);
                                                            if (uVar2 == 0) {
                                                              uVar2 = ref_list_push((REF_LIST)
                                                                                    ref_mpi,0x16);
                                                              if (uVar2 == 0) {
                                                                uVar2 = ref_list_push((REF_LIST)
                                                                                      ref_mpi,0x17);
                                                                if (uVar2 == 0) {
                                                                  if ((long)ref_mpi->n == 3) {
                                                                    uVar2 = ref_list_delete((
                                                  REF_LIST)ref_mpi,0x15);
                                                  if (uVar2 == 0) {
                                                    if ((long)ref_mpi->n == 2) {
                                                      uVar2 = ref_list_delete((REF_LIST)ref_mpi,0x17
                                                                             );
                                                      if (uVar2 == 0) {
                                                        if ((long)ref_mpi->n == 1) {
                                                          uVar2 = ref_list_delete((REF_LIST)ref_mpi,
                                                                                  0x16);
                                                          if (uVar2 == 0) {
                                                            if ((long)ref_mpi->n == 0) {
                                                              uVar2 = ref_list_free((REF_LIST)
                                                                                    ref_mpi);
                                                              if (uVar2 == 0) {
                                                                uVar2 = ref_mpi_free(
                                                  _ref_private_macro_code_rss_1);
                                                  if (uVar2 == 0) {
                                                    uVar2 = ref_mpi_stop();
                                                    if (uVar2 == 0) {
                                                      argv_local._4_4_ = 0;
                                                    }
                                                    else {
                                                      printf("%s: %d: %s: %d %s\n",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x8c,"main",(ulong)uVar2,"stop");
                                                  argv_local._4_4_ = uVar2;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x8b,"main",(ulong)uVar2,"mpi free");
                                                  argv_local._4_4_ = uVar2;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x88,"main",(ulong)uVar2,"free");
                                                  argv_local._4_4_ = uVar2;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x86,"main","has 0",0,(long)ref_mpi->n);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x85,"main",(ulong)uVar2,"have");
                                                  argv_local._4_4_ = uVar2;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x82,"main","has 1",1,(long)ref_mpi->n);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x81,"main",(ulong)uVar2,"have");
                                                  argv_local._4_4_ = uVar2;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x7e,"main","has 2",2,(long)ref_mpi->n);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x7d,"main",(ulong)uVar2,"have");
                                                  argv_local._4_4_ = uVar2;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x7a,"main","has 3",3,(long)ref_mpi->n);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x79,"main",(ulong)uVar2,"add");
                                                  argv_local._4_4_ = uVar2;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x77,"main",(ulong)uVar2,"add");
                                                  argv_local._4_4_ = uVar2;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x75,"main",(ulong)uVar2,"add");
                                                  argv_local._4_4_ = uVar2;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x72,"main","rm",5,(long)RVar1);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x6f,"main",(ulong)uVar2,"create");
                                                  argv_local._4_4_ = uVar2;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x6a,"main",(ulong)uVar2,"free");
                                                  argv_local._4_4_ = uVar2;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x69,"main","does have",0,
                                                  (long)ref_private_macro_code_rss_24);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x68,"main",(ulong)uVar2,"have");
                                                  argv_local._4_4_ = uVar2;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x67,"main","does have",1,
                                                  (long)ref_private_macro_code_rss_24);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x66,"main",(ulong)uVar2,"have");
                                                  argv_local._4_4_ = uVar2;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x65,"main",(ulong)uVar2,"add");
                                                  argv_local._4_4_ = uVar2;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,99,"main",(ulong)uVar2,"create");
                                                  argv_local._4_4_ = uVar2;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x5d,"main",(ulong)(uint)contains,"free");
                                                  argv_local._4_4_ = contains;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x5b,"main","has none",0,_item_3);
                                                  argv_local._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x59,"main",
                                                  (ulong)(uint)ref_private_status_reis_ai_5,"rm -rf"
                                                  );
                                                  argv_local._4_4_ =
                                                       (uint)ref_private_status_reis_ai_5;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x57,"main",
                                                  (ulong)ref_private_status_reis_ai_5._4_4_,"store")
                                                  ;
                                                  argv_local._4_4_ =
                                                       ref_private_status_reis_ai_5._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x56,"main",
                                                  (ulong)(uint)ref_private_macro_code_rss_21,"store"
                                                  );
                                                  argv_local._4_4_ = ref_private_macro_code_rss_21;
                                                  }
                                                }
                                                else {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x55,"main",
                                                  (ulong)(uint)ref_private_macro_code_rss_20,
                                                  "create");
                                                  argv_local._4_4_ = ref_private_macro_code_rss_20;
                                                }
                                              }
                                              else {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x51,"main",
                                                  (ulong)(uint)ref_private_macro_code_rss_19,"free")
                                                ;
                                                argv_local._4_4_ = ref_private_macro_code_rss_19;
                                              }
                                            }
                                            else {
                                              printf("%s: %d: %s: %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x50,"main","more?");
                                              argv_local._4_4_ = 1;
                                            }
                                          }
                                          else {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                  ,0x4b,"main",
                                                  (ulong)(uint)ref_private_macro_code_rss_17,
                                                  "create");
                                            argv_local._4_4_ = ref_private_macro_code_rss_17;
                                          }
                                        }
                                        else {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                                 ,0x46,"main",(ulong)(uint)max,"free");
                                          argv_local._4_4_ = max;
                                        }
                                      }
                                      else {
                                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                               ,0x44,"main","has none",0,_item_2);
                                        argv_local._4_4_ = 1;
                                      }
                                    }
                                    else {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                             ,0x43,"main",(ulong)(uint)ref_private_status_reis_ai_4,
                                             "rm");
                                      argv_local._4_4_ = (uint)ref_private_status_reis_ai_4;
                                    }
                                  }
                                  else {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                           ,0x42,"main",(ulong)ref_private_status_reis_ai_4._4_4_,
                                           "add");
                                    argv_local._4_4_ = ref_private_status_reis_ai_4._4_4_;
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                         ,0x3f,"main","rm",ref_private_status_reis_bi_3,
                                         _ref_private_macro_code_rss_13);
                                  argv_local._4_4_ = 1;
                                }
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                       ,0x3d,"main",(ulong)(uint)ref_private_status_reis_ai_3,
                                       "create");
                                argv_local._4_4_ = (uint)ref_private_status_reis_ai_3;
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                     ,0x38,"main",(ulong)(uint)last,"free");
                              argv_local._4_4_ = last;
                            }
                          }
                          else {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                   ,0x37,"main","has one",1,_item_1);
                            argv_local._4_4_ = 1;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                                 ,0x36,"main",(ulong)ref_private_status_reis_ai_2._4_4_,"add");
                          argv_local._4_4_ = ref_private_status_reis_ai_2._4_4_;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                               ,0x34,"main",(ulong)local_80,"create");
                        argv_local._4_4_ = local_80;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                             ,0x2f,"main",(ulong)(uint)ref_private_macro_code_rss_8,"free");
                      argv_local._4_4_ = ref_private_macro_code_rss_8;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                           ,0x2e,"main",(ulong)(uint)item,"free");
                    argv_local._4_4_ = item;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                         ,0x2d,"main",(ulong)(uint)ref_private_macro_code_rss_7,"deep copy");
                  argv_local._4_4_ = ref_private_macro_code_rss_7;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                       ,0x2c,"main",(ulong)(uint)ref_private_macro_code_rss_6,"create");
                argv_local._4_4_ = ref_private_macro_code_rss_6;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                     ,0x27,"main",(ulong)original._4_4_,"free");
              argv_local._4_4_ = original._4_4_;
            }
          }
          else {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                   ,0x26,"main","init zero",0,lStack_58);
            argv_local._4_4_ = 1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
                 ,0x25,"main",(ulong)ref_private_status_reis_ai_1._4_4_,"create");
          argv_local._4_4_ = ref_private_status_reis_ai_1._4_4_;
        }
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c"
               ,0x24,"main","dont free NULL",ref_private_status_reis_bi,lStack_40);
        argv_local._4_4_ = 1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
             0x21,"main",(ulong)(uint)ref_private_status_reis_ai,"make mpi");
      argv_local._4_4_ = (uint)ref_private_status_reis_ai;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list_test.c",
           0x20,"main",(ulong)ref_private_status_reis_ai._4_4_,"start");
    argv_local._4_4_ = ref_private_status_reis_ai._4_4_;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
  REF_LIST ref_list;
  REF_MPI ref_mpi;
  RSS(ref_mpi_start(argc, argv), "start");
  RSS(ref_mpi_create(&ref_mpi), "make mpi");

  {
    REIS(REF_NULL, ref_list_free(NULL), "dont free NULL");
    RSS(ref_list_create(&ref_list), "create");
    REIS(0, ref_list_n(ref_list), "init zero");
    RSS(ref_list_free(ref_list), "free");
  }

  { /* deep copy empty */
    REF_LIST original;
    RSS(ref_list_create(&original), "create");
    RSS(ref_list_deep_copy(&ref_list, original), "deep copy");
    RSS(ref_list_free(original), "free");
    RSS(ref_list_free(ref_list), "free");
  }

  { /* store one */
    REF_INT item;
    RSS(ref_list_create(&ref_list), "create");
    item = 27;
    RSS(ref_list_push(ref_list, item), "add");
    REIS(1, ref_list_n(ref_list), "has one");
    RSS(ref_list_free(ref_list), "free");
  }

  { /* remove */
    REF_INT item, last;
    RSS(ref_list_create(&ref_list), "create");

    REIS(REF_FAILURE, ref_list_pop(ref_list, &last), "rm");

    item = 27;
    RSS(ref_list_push(ref_list, item), "add");
    RSS(ref_list_pop(ref_list, &last), "rm");
    REIS(0, ref_list_n(ref_list), "has none");

    RSS(ref_list_free(ref_list), "free");
  }

  { /* store lots */
    REF_INT item, max;
    RSS(ref_list_create(&ref_list), "create");
    max = ref_list_max(ref_list);
    for (item = 0; item <= max; item++) {
      RSS(ref_list_push(ref_list, item), "store");
    }
    RAS(ref_list_max(ref_list) > max, "more?");
    RSS(ref_list_free(ref_list), "free");
  }

  { /* erase */
    RSS(ref_list_create(&ref_list), "create");
    RSS(ref_list_push(ref_list, 20), "store");
    RSS(ref_list_push(ref_list, 10), "store");

    RSS(ref_list_erase(ref_list), "rm -rf");

    REIS(0, ref_list_n(ref_list), "has none");

    RSS(ref_list_free(ref_list), "free");
  }

  { /* contains */
    REF_INT item;
    REF_BOOL contains;
    RSS(ref_list_create(&ref_list), "create");
    item = 27;
    RSS(ref_list_push(ref_list, item), "add");
    RSS(ref_list_contains(ref_list, item, &contains), "have");
    REIS(REF_TRUE, contains, "does have");
    RSS(ref_list_contains(ref_list, 5, &contains), "have");
    REIS(REF_FALSE, contains, "does have");
    RSS(ref_list_free(ref_list), "free");
  }

  { /* delete first */
    REF_INT item;
    RSS(ref_list_create(&ref_list), "create");

    item = 5;
    REIS(REF_NOT_FOUND, ref_list_delete(ref_list, item), "rm");

    item = 21;
    RSS(ref_list_push(ref_list, item), "add");
    item = 22;
    RSS(ref_list_push(ref_list, item), "add");
    item = 23;
    RSS(ref_list_push(ref_list, item), "add");
    REIS(3, ref_list_n(ref_list), "has 3");

    item = 21;
    RSS(ref_list_delete(ref_list, item), "have");
    REIS(2, ref_list_n(ref_list), "has 2");

    item = 23;
    RSS(ref_list_delete(ref_list, item), "have");
    REIS(1, ref_list_n(ref_list), "has 1");

    item = 22;
    RSS(ref_list_delete(ref_list, item), "have");
    REIS(0, ref_list_n(ref_list), "has 0");

    RSS(ref_list_free(ref_list), "free");
  }

  RSS(ref_mpi_free(ref_mpi), "mpi free");
  RSS(ref_mpi_stop(), "stop");

  return 0;
}